

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O3

void set_dimen_values(dill_stream s,sm_ref top,sm_ref this,int dimension)

{
  sm_ref expr;
  long size;
  long local_30 [6];
  
  while( true ) {
    local_30[0] = -1;
    if (this->node_type != cod_array_type_decl) break;
    expr = (this->node).enumerator.const_expression;
    if (expr != (sm_ref)0x0) {
      evaluate_constant_expr(s,expr,local_30);
      ((top->node).array_type_decl.dimensions)->dimens[dimension].static_size = (int)local_30[0];
    }
    this = (this->node).declaration.freeable_complex_type;
    dimension = dimension + 1;
  }
  return;
}

Assistant:

static void
set_dimen_values(dill_stream s, sm_ref top, sm_ref this, int dimension)
{
    long size = -1;
    if (this->node_type != cod_array_type_decl) return;
    if (this->node.array_type_decl.size_expr) {
	evaluate_constant_expr(s, this->node.array_type_decl.size_expr, &size);
	top->node.array_type_decl.dimensions->dimens[dimension].static_size = size;
    }
    set_dimen_values(s, top, this->node.array_type_decl.element_ref, dimension+1);
}